

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O1

int ranges::detail::
    variant_visit_<ranges::detail::variant_data_<meta::list<ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,0ul>>,ranges::detail::indexed_datum<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::integral_constant<unsigned_long,1ul>>>,true>::type,ranges::detail::variant_visitor<ranges::concat_view<ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::ref_view<std::vector<double,std::allocator<double>>>>::cursor<true>::next_fun,ranges::variant<void,void>>,ranges::detail::indexed_element_fn>
              (long n,long *self,cursor<true> *param_3,long param_4)

{
  if (n == 0) {
    *self = *self + 8;
    concat_view<ranges::ref_view<std::vector<double,std::allocator<double>>>,ranges::ref_view<std::vector<double,std::allocator<double>>>>
    ::cursor<true>::satisfy<0ul>(param_3);
    if (*(long *)(param_4 + 8) != -1) {
      *(undefined8 *)(param_4 + 8) = 0xffffffffffffffff;
    }
    *(undefined8 *)(param_4 + 8) = 0;
  }
  else {
    *self = *self + 8;
    if (*(long *)(param_4 + 8) != -1) {
      *(undefined8 *)(param_4 + 8) = 0xffffffffffffffff;
    }
    *(undefined8 *)(param_4 + 8) = 1;
  }
  return 0;
}

Assistant:

constexpr int variant_visit_(std::size_t n, Data & self, Fun fun, Proj proj = {})
        {
            return 0 == n ? ((void)invoke(fun, invoke(proj, self.head)), 0)
                          : detail::variant_visit_(
                                n - 1, self.tail, detail::move(fun), detail::move(proj));
        }